

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void ceilingFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  code *pcVar1;
  int iVar2;
  i64 val;
  double val_00;
  
  iVar2 = sqlite3_value_numeric_type(*argv);
  if (iVar2 == 2) {
    pcVar1 = (code *)context->pFunc->pUserData;
    sqlite3VdbeRealValue(*argv);
    val_00 = (double)(*pcVar1)();
    sqlite3VdbeMemSetDouble(context->pOut,val_00);
    return;
  }
  if (iVar2 == 1) {
    val = sqlite3VdbeIntValue(*argv);
    pMem = context->pOut;
    if ((pMem->flags & 0x9000) != 0) {
      vdbeReleaseAndSetInt64(pMem,val);
      return;
    }
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void ceilingFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  switch( sqlite3_value_numeric_type(argv[0]) ){
    case SQLITE_INTEGER: {
       sqlite3_result_int64(context, sqlite3_value_int64(argv[0]));
       break;
    }
    case SQLITE_FLOAT: {
       double (*x)(double) = (double(*)(double))sqlite3_user_data(context);
       sqlite3_result_double(context, x(sqlite3_value_double(argv[0])));
       break;
    }
    default: {
       break;
    }
  }
}